

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O1

void resizeCube(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,float filterRadius,
               int numSamples)

{
  int iVar1;
  Rgba *__dest;
  Envmap EVar2;
  Box2i *pBVar3;
  Array2D<Imf_3_4::Rgba> *pAVar4;
  Rgba RVar5;
  int iVar6;
  uint uVar7;
  int x;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  V2f posInFace;
  V2f pos;
  V3f dir;
  float local_70;
  float local_6c;
  Box2i *local_68;
  EnvmapImage *local_60;
  V3f local_58;
  undefined8 local_48;
  V3f local_40;
  
  iVar6 = numSamples;
  EVar2 = EnvmapImage::type(image1);
  if (EVar2 == ENVMAP_CUBE) {
    pBVar3 = EnvmapImage::dataWindow(image1);
    iVar10 = -(uint)((image2DataWindow->min).x == (pBVar3->min).x);
    iVar11 = -(uint)((image2DataWindow->min).y == (pBVar3->min).y);
    auVar8._4_4_ = iVar10;
    auVar8._0_4_ = iVar10;
    auVar8._8_4_ = iVar11;
    auVar8._12_4_ = iVar11;
    iVar6 = movmskpd(iVar6,auVar8);
    if ((iVar6 == 3) &&
       (iVar6 = -(uint)((image2DataWindow->max).x == (pBVar3->max).x),
       iVar10 = -(uint)((image2DataWindow->max).y == (pBVar3->max).y), auVar9._4_4_ = iVar6,
       auVar9._0_4_ = iVar6, auVar9._8_4_ = iVar10, auVar9._12_4_ = iVar10,
       iVar6 = movmskpd((int)pBVar3,auVar9), iVar6 == 3)) {
      EnvmapImage::resize(image2,ENVMAP_CUBE,image2DataWindow);
      iVar6 = (image2DataWindow->max).x;
      iVar10 = (image2DataWindow->max).y;
      iVar11 = (image2DataWindow->min).x;
      iVar1 = (image2DataWindow->min).y;
      pAVar4 = EnvmapImage::pixels(image2);
      __dest = pAVar4->_data;
      pAVar4 = EnvmapImage::pixels(image1);
      memcpy(__dest,pAVar4->_data,(long)((iVar10 - iVar1) + 1) * (long)((iVar6 - iVar11) + 1) * 8);
      return;
    }
  }
  local_60 = image1;
  iVar6 = Imf_3_4::CubeMap::sizeOfFace((Box *)image2DataWindow);
  local_68 = image2DataWindow;
  EnvmapImage::resize(image2,ENVMAP_CUBE,image2DataWindow);
  EnvmapImage::clear(image2);
  pAVar4 = EnvmapImage::pixels(image2);
  pBVar3 = local_68;
  uVar7 = 0;
  do {
    if (0 < iVar6) {
      iVar10 = 0;
      do {
        iVar11 = 0;
        do {
          Imf_3_4::CubeMap::direction((CubeMapFace)&local_40,(Box *)(ulong)uVar7,(Vec2 *)pBVar3);
          local_48 = CONCAT44((float)iVar10,(float)iVar11);
          Imf_3_4::CubeMap::pixelPosition(&local_70,uVar7,pBVar3,&local_48);
          local_58.x = local_40.x;
          local_58.y = local_40.y;
          local_58.z = local_40.z;
          RVar5 = EnvmapImage::filteredLookup
                            (local_60,&local_58,(filterRadius * 1.5) / (float)iVar6,numSamples);
          pAVar4->_data[(long)(int)(local_6c + 0.5) * pAVar4->_sizeY + (long)(int)(local_70 + 0.5)]
               = RVar5;
          iVar11 = iVar11 + 1;
        } while (iVar6 != iVar11);
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 6);
  return;
}

Assistant:

void
resizeCube (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    if (image1.type () == ENVMAP_CUBE &&
        image1.dataWindow () == image2DataWindow)
    {
        //
        // Special case - the input image is a cube-face environment
        // map with the same size as the output image.  We can copy
        // the input image without resampling.
        //

        image2.resize (ENVMAP_CUBE, image2DataWindow);

        int w = image2DataWindow.max.x - image2DataWindow.min.x + 1;
        int h = image2DataWindow.max.y - image2DataWindow.min.y + 1;

        memcpy (
            &(image2.pixels ()[0][0]),
            &(image1.pixels ()[0][0]),
            sizeof (Rgba) * w * h);

        return;
    }

    //
    // Resampe the input image
    //

    int   sof    = CubeMap::sizeOfFace (image2DataWindow);
    float radius = 1.5f * filterRadius / sof;

    image2.resize (ENVMAP_CUBE, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
    {
        CubeMapFace face = CubeMapFace (f);

        for (int y = 0; y < sof; ++y)
        {
            for (int x = 0; x < sof; ++x)
            {
                V2f posInFace (x, y);

                V3f dir =
                    CubeMap::direction (face, image2DataWindow, posInFace);

                V2f pos =
                    CubeMap::pixelPosition (face, image2DataWindow, posInFace);

                pixels[int (pos.y + 0.5f)][int (pos.x + 0.5f)] =
                    image1.filteredLookup (dir, radius, numSamples);
            }
        }
    }
}